

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

int cgltf_parse_json_cameras
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,
              cgltf_data *out_data)

{
  int iVar1;
  uint i_00;
  int iVar2;
  cgltf_camera_type cVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  cgltf_camera *out_string;
  ulong uVar7;
  int iVar8;
  cgltf_size *out_array;
  jsmntok_t *pjVar9;
  int iVar10;
  cgltf_float cVar11;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  uint local_74;
  
  out_array = &out_data->cameras_count;
  i_00 = cgltf_parse_json_array
                   (options,tokens,i,(uint8_t *)0x50,(size_t)&out_data->cameras,(void **)out_array,
                    (cgltf_size *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if ((-1 < (int)i_00) && (*out_array != 0)) {
    uVar7 = 0;
    do {
      if (tokens[i_00].type == JSMN_OBJECT) {
        iVar1 = tokens[i_00].size;
        i_00 = i_00 + 1;
        if (0 < iVar1) {
          out_string = out_data->cameras + uVar7;
          iVar10 = 0;
          do {
            if ((tokens[i_00].type != JSMN_STRING) || (pjVar9 = tokens + i_00, pjVar9->size == 0))
            goto LAB_001127e1;
            iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"name");
            if (iVar2 == 0) {
              uVar5 = cgltf_parse_json_string(options,tokens,i_00 + 1,json_chunk,&out_string->name);
            }
            else {
              iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"type");
              if (iVar2 == 0) {
                iVar2 = cgltf_json_strcmp(tokens + (long)(int)i_00 + 1,json_chunk,"perspective");
                if (iVar2 == 0) {
                  cVar3 = cgltf_camera_type_perspective;
LAB_00112757:
                  out_string->type = cVar3;
                }
                else {
                  iVar2 = cgltf_json_strcmp(tokens + (long)(int)i_00 + 1,json_chunk,"orthographic");
                  if (iVar2 == 0) {
                    cVar3 = cgltf_camera_type_orthographic;
                    goto LAB_00112757;
                  }
                }
                uVar5 = i_00 + 2;
              }
              else {
                iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"perspective");
                if (iVar2 == 0) {
                  if (tokens[(long)(int)i_00 + 1].type != JSMN_OBJECT) goto LAB_001127e1;
                  iVar2 = tokens[(long)(int)i_00 + 1].size;
                  uVar5 = i_00 + 2;
                  out_string->type = cgltf_camera_type_perspective;
                  bVar6 = 0 < iVar2;
                  if (iVar2 < 1) {
LAB_00112765:
                    uVar5 = i_00 + 2;
                    i_00 = local_74;
                  }
                  else {
                    if ((tokens[uVar5].type == JSMN_STRING) &&
                       (pjVar9 = tokens + uVar5, pjVar9->size != 0)) {
                      iVar8 = 1;
                      do {
                        iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"aspectRatio");
                        if (iVar4 == 0) {
                          cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                          (out_string->data).perspective.aspect_ratio = cVar11;
LAB_00112519:
                          uVar5 = uVar5 + 2;
                        }
                        else {
                          iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"yfov");
                          if (iVar4 == 0) {
                            cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                            (out_string->data).perspective.yfov = cVar11;
                            goto LAB_00112519;
                          }
                          iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"zfar");
                          if (iVar4 == 0) {
                            cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                            (out_string->data).perspective.zfar = cVar11;
                            goto LAB_00112519;
                          }
                          iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"znear");
                          if (iVar4 == 0) {
                            cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                            (out_string->data).perspective.znear = cVar11;
                            goto LAB_00112519;
                          }
                          iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"extras");
                          uVar5 = uVar5 + 1;
                          if (iVar4 == 0) {
                            *(long *)((long)&out_string->data + 0x10) = (long)tokens[uVar5].start;
                            *(long *)((long)&out_string->data + 0x18) = (long)tokens[uVar5].end;
                          }
                          uVar5 = cgltf_skip_json(tokens,uVar5);
                        }
                        i_00 = uVar5;
                        if (((int)uVar5 < 0) ||
                           (bVar6 = iVar8 < iVar2, i_00 = local_74, iVar8 == iVar2))
                        goto LAB_001127c0;
                        if (tokens[uVar5].type != JSMN_STRING) break;
                        pjVar9 = tokens + uVar5;
                        iVar8 = iVar8 + 1;
                      } while (pjVar9->size != 0);
                      goto LAB_00112744;
                    }
LAB_0011274b:
                    uVar5 = i_00 + 2;
                    i_00 = 0xffffffff;
                  }
                }
                else {
                  iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"orthographic");
                  if (iVar2 != 0) {
                    iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"extras");
                    if (iVar2 == 0) {
                      (out_string->extras).start_offset = (long)tokens[i_00 + 1].start;
                      (out_string->extras).end_offset = (long)tokens[i_00 + 1].end;
                    }
                    else {
                      iVar2 = cgltf_json_strcmp(pjVar9,json_chunk,"extensions");
                      if (iVar2 == 0) {
                        uVar5 = cgltf_parse_json_unprocessed_extensions
                                          (options,tokens,i_00,json_chunk,
                                           &out_string->extensions_count,&out_string->extensions);
                        goto LAB_001127c9;
                      }
                    }
                    uVar5 = cgltf_skip_json(tokens,i_00 + 1);
                    goto LAB_001127c9;
                  }
                  if (tokens[(long)(int)i_00 + 1].type != JSMN_OBJECT) goto LAB_001127e1;
                  iVar2 = tokens[(long)(int)i_00 + 1].size;
                  uVar5 = i_00 + 2;
                  out_string->type = cgltf_camera_type_orthographic;
                  bVar6 = 0 < iVar2;
                  if (iVar2 < 1) goto LAB_00112765;
                  if ((tokens[uVar5].type != JSMN_STRING) ||
                     (pjVar9 = tokens + uVar5, pjVar9->size == 0)) goto LAB_0011274b;
                  iVar8 = 1;
                  do {
                    iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"xmag");
                    if (iVar4 == 0) {
                      cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                      (out_string->data).perspective.aspect_ratio = cVar11;
LAB_00112704:
                      uVar5 = uVar5 + 2;
                    }
                    else {
                      iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"ymag");
                      if (iVar4 == 0) {
                        cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                        (out_string->data).perspective.yfov = cVar11;
                        goto LAB_00112704;
                      }
                      iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"zfar");
                      if (iVar4 == 0) {
                        cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                        (out_string->data).perspective.zfar = cVar11;
                        goto LAB_00112704;
                      }
                      iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"znear");
                      if (iVar4 == 0) {
                        cVar11 = cgltf_json_to_float(tokens + (long)(int)uVar5 + 1,json_chunk);
                        (out_string->data).perspective.znear = cVar11;
                        goto LAB_00112704;
                      }
                      iVar4 = cgltf_json_strcmp(pjVar9,json_chunk,"extras");
                      uVar5 = uVar5 + 1;
                      if (iVar4 == 0) {
                        *(long *)((long)&out_string->data + 0x10) = (long)tokens[uVar5].start;
                        *(long *)((long)&out_string->data + 0x18) = (long)tokens[uVar5].end;
                      }
                      uVar5 = cgltf_skip_json(tokens,uVar5);
                    }
                    i_00 = uVar5;
                    if (((int)uVar5 < 0) || (bVar6 = iVar8 < iVar2, i_00 = local_74, iVar8 == iVar2)
                       ) goto LAB_001127c0;
                    if (tokens[uVar5].type != JSMN_STRING) break;
                    pjVar9 = tokens + uVar5;
                    iVar8 = iVar8 + 1;
                  } while (pjVar9->size != 0);
LAB_00112744:
                  i_00 = 0xffffffff;
                }
LAB_001127c0:
                local_74 = i_00;
                if ((bVar6 & 1) != 0) break;
              }
            }
LAB_001127c9:
            i_00 = uVar5;
            if (((int)i_00 < 0) || (iVar10 = iVar10 + 1, iVar10 == iVar1)) break;
          } while( true );
        }
      }
      else {
LAB_001127e1:
        i_00 = 0xffffffff;
      }
    } while ((-1 < (int)i_00) && (uVar7 = uVar7 + 1, uVar7 < *out_array));
  }
  return i_00;
}

Assistant:

static int cgltf_parse_json_cameras(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, cgltf_data* out_data)
{
	i = cgltf_parse_json_array(options, tokens, i, json_chunk, sizeof(cgltf_camera), (void**)&out_data->cameras, &out_data->cameras_count);
	if (i < 0)
	{
		return i;
	}

	for (cgltf_size j = 0; j < out_data->cameras_count; ++j)
	{
		i = cgltf_parse_json_camera(options, tokens, i, json_chunk, &out_data->cameras[j]);
		if (i < 0)
		{
			return i;
		}
	}
	return i;
}